

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::SetWasCalledFromLoop(FunctionBody *this)

{
  ushort uVar1;
  uint loopInterpreterLimit;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32 uVar8;
  undefined4 *puVar9;
  FunctionInfo *pFVar10;
  void *pvVar11;
  long lVar12;
  uint uVar13;
  uint loopInterpreterLimit_00;
  
  if ((short)*(uint *)&this->field_0x178 < 0) {
    return;
  }
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 | 0x8000;
  if (DAT_015a4e38 == '\x01') {
    pFVar10 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    uVar6 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_007705bc;
      *puVar9 = 0;
      pFVar10 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_015b6718,ExecutionModePhase,uVar6,pFVar10->functionId);
    if (bVar4) {
      FunctionExecutionStateMachine::CommitExecutedIterations(&this->executionState);
      TraceExecutionMode(this,"WasCalledFromLoop (before)");
    }
  }
  else {
    FunctionExecutionStateMachine::CommitExecutedIterations(&this->executionState);
    TraceExecutionMode(this,"WasCalledFromLoop (before)");
    uVar1 = (this->executionState).fullJitThreshold;
    if (1 < uVar1) {
      FunctionExecutionStateMachine::SetFullJitThreshold
                (&this->executionState,uVar1 >> 1,(bool)(DAT_015a4e4c ^ 1));
    }
  }
  uVar2 = DAT_015a1ee8;
  loopInterpreterLimit = this->loopInterpreterLimit;
  bVar4 = ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Configuration::Global,LoopInterpretCountFlag);
  loopInterpreterLimit_00 = uVar2;
  if (!bVar4) {
    uVar5 = (DAT_015a4e4c ^ 1) * 9 + 0x10;
    if (uVar5 < uVar2) {
      loopInterpreterLimit_00 = uVar5;
    }
    if (loopInterpreterLimit_00 < uVar2 / 3) {
      loopInterpreterLimit_00 = uVar2 / 3;
    }
  }
  if (loopInterpreterLimit < loopInterpreterLimit_00) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1c4e,"(newLoopInterpreterLimit <= oldLoopInterpreterLimit)",
                                "newLoopInterpreterLimit <= oldLoopInterpreterLimit");
    if (!bVar4) {
LAB_007705bc:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  this->loopInterpreterLimit = loopInterpreterLimit_00;
  uVar6 = GetLoopProfileThreshold(this,loopInterpreterLimit);
  uVar7 = GetLoopProfileThreshold(this,loopInterpreterLimit_00);
  pvVar11 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LoopHeaderArray);
  if (pvVar11 != (void *)0x0) {
    uVar8 = GetCountField(this,LoopCount);
    if (uVar8 != 0) {
      lVar12 = 0;
      do {
        uVar2 = *(uint *)((long)pvVar11 + lVar12 + 0x10);
        if (uVar2 < loopInterpreterLimit && uVar7 < uVar2) {
          uVar13 = (uVar7 - uVar6) + uVar2;
          if (uVar2 <= uVar6) {
            uVar13 = uVar7;
          }
          *(uint *)((long)pvVar11 + lVar12 + 0x10) = uVar13;
        }
        lVar12 = lVar12 + 0x30;
      } while ((ulong)uVar8 * 0x30 != lVar12);
    }
  }
  TraceExecutionMode(this,"WasCalledFromLoop");
  return;
}

Assistant:

void FunctionBody::SetWasCalledFromLoop()
    {
        if(wasCalledFromLoop)
        {
            return;
        }
        wasCalledFromLoop = true;

        if(Configuration::Global.flags.EnforceExecutionModeLimits)
        {
            if(PHASE_TRACE(Phase::ExecutionModePhase, this))
            {
                executionState.CommitExecutedIterations();
                TraceExecutionMode("WasCalledFromLoop (before)");
            }
        }
        else
        {
            // This function is likely going to be called frequently since it's called from a loop. Reduce the full JIT
            // threshold to realize the full JIT perf benefit sooner.
            executionState.CommitExecutedIterations();
            TraceExecutionMode("WasCalledFromLoop (before)");
            uint16 fullJitThreshold = executionState.GetFullJitThreshold();
            if(fullJitThreshold > 1)
            {
                executionState.SetFullJitThreshold(fullJitThreshold / 2, !CONFIG_FLAG(NewSimpleJit));
            }
        }

        {
            // Reduce the loop interpreter limit too, for the same reasons as above
            const uint oldLoopInterpreterLimit = GetLoopInterpreterLimit();
            const uint newLoopInterpreterLimit = GetReducedLoopInterpretCount();
            Assert(newLoopInterpreterLimit <= oldLoopInterpreterLimit);
            SetLoopInterpreterLimit(newLoopInterpreterLimit);

            // Adjust loop headers' interpret counts to ensure that loops will still be profiled a number of times before
            // loop bodies are jitted
            const uint oldLoopProfileThreshold = GetLoopProfileThreshold(oldLoopInterpreterLimit);
            const uint newLoopProfileThreshold = GetLoopProfileThreshold(newLoopInterpreterLimit);
            MapLoopHeaders([=](const uint index, LoopHeader *const loopHeader)
            {
                const uint interpretedCount = loopHeader->interpretCount;
                if(interpretedCount <= newLoopProfileThreshold || interpretedCount >= oldLoopInterpreterLimit)
                {
                    // The loop hasn't been profiled yet and wouldn't have started profiling even with the new profile
                    // threshold, or it has already been profiled the necessary minimum number of times based on the old limit
                    return;
                }

                if(interpretedCount <= oldLoopProfileThreshold)
                {
                    // The loop hasn't been profiled yet, but would have started profiling with the new profile threshold. Start
                    // profiling on the next iteration.
                    loopHeader->interpretCount = newLoopProfileThreshold;
                    return;
                }

                // The loop has been profiled some already. Preserve the number of profiled iterations.
                loopHeader->interpretCount = newLoopProfileThreshold + (interpretedCount - oldLoopProfileThreshold);
            });
        }

        TraceExecutionMode("WasCalledFromLoop");
    }